

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O0

void tmcnth_write(int n,uint16_t old_value)

{
  byte bVar1;
  gbabus_t *pgVar2;
  int i;
  TMCNT_H_t old;
  uint16_t old_value_local;
  int n_local;
  
  bus->TMSTART[n] = (_Bool)((byte)(bus->TMCNT_H[n].raw >> 7) & 1);
  if (((old_value >> 7 & 1) == 0) && ((bus->TMCNT_H[n].raw >> 7 & 1) != 0)) {
    bus->TMINT[n].ticks = 0;
    *(TMCNT_L_t *)(bus->TMINT + n) = bus->TMCNT_L[n];
  }
  bus->num_active_timers = '\0';
  for (i = 0; pgVar2 = bus, i < 4; i = i + 1) {
    if (((bus->TMCNT_H[i].raw >> 7 & 1) != 0) && ((bus->TMCNT_H[i].raw >> 2 & 1) == 0)) {
      bVar1 = bus->num_active_timers;
      bus->num_active_timers = bVar1 + 1;
      pgVar2->TMACTIVE[bVar1] = (uint8_t)i;
    }
  }
  return;
}

Assistant:

void tmcnth_write(int n, half old_value) {
    TMCNT_H_t old;
    old.raw = old_value;
    bus->TMSTART[n] = bus->TMCNT_H[n].start;
    if (!old.start && bus->TMCNT_H[n].start) {
        bus->TMINT[n].ticks = 0;
        bus->TMINT[n].value = bus->TMCNT_L[n].timer_reload;
    }

    bus->num_active_timers = 0;
    for (int i = 0; i < 4; i++) {
        if (bus->TMCNT_H[i].start && !bus->TMCNT_H[i].cascade) {
            bus->TMACTIVE[bus->num_active_timers++] = i;
        }
    }
}